

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O0

void __thiscall wasm::Binary::finalize(Binary *this)

{
  bool bVar1;
  bool local_39;
  Type local_28;
  Type local_20;
  BasicType local_18 [2];
  Binary *local_10;
  Binary *this_local;
  
  bVar1 = false;
  if (this->left != (Expression *)0x0) {
    bVar1 = this->right != (Expression *)0x0;
  }
  local_10 = this;
  if (bVar1) {
    local_18[1] = 1;
    bVar1 = wasm::Type::operator==(&this->left->type,local_18 + 1);
    local_39 = true;
    if (!bVar1) {
      local_18[0] = unreachable;
      local_39 = wasm::Type::operator==(&this->right->type,local_18);
    }
    if (local_39 == false) {
      bVar1 = isRelational(this);
      if (bVar1) {
        wasm::Type::Type(&local_28,i32);
        (this->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id =
             local_28.id;
      }
      else {
        (this->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id =
             (this->left->type).id;
      }
    }
    else {
      wasm::Type::Type(&local_20,unreachable);
      (this->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id =
           local_20.id;
    }
    return;
  }
  __assert_fail("left && right",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm.cpp"
                ,0x2fd,"void wasm::Binary::finalize()");
}

Assistant:

void Binary::finalize() {
  assert(left && right);
  if (left->type == Type::unreachable || right->type == Type::unreachable) {
    type = Type::unreachable;
  } else if (isRelational()) {
    type = Type::i32;
  } else {
    type = left->type;
  }
}